

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O0

void __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
::solver_random_inequalities_101coeff
          (solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  type piVar4;
  type pbVar5;
  int *piVar6;
  size_t __i;
  int local_74;
  reference local_70;
  function_element *cst;
  const_iterator __end4;
  const_iterator __begin4;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range4;
  int upper;
  int lower;
  int e;
  int i;
  int id;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_30;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *csts_local;
  cost_type *c__local;
  int n__local;
  int m__local;
  random_engine *rng__local;
  solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
  *this_local;
  
  this->rng = rng_;
  local_30 = csts;
  csts_local = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)c_;
  c__local._0_4_ = n_;
  c__local._4_4_ = m_;
  _n__local = rng_;
  rng__local = (random_engine *)this;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  sparse_matrix<int>::size(&this->ap);
  std::make_unique<int[]>((size_t)&this->A);
  compute_reduced_costs_vector_size(local_30);
  std::
  make_unique<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data[]>
            ((size_t)&this->R);
  std::
  make_unique<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::bound_factor[]>
            ((size_t)&this->b);
  std::make_unique<float[]>((size_t)&this->pi);
  sparse_matrix<int>::size(&this->ap);
  std::make_unique<float[]>((size_t)&this->P);
  this->c = (cost_type *)csts_local;
  std::bernoulli_distribution::bernoulli_distribution(&this->dist,0.5);
  this->m = c__local._4_4_;
  this->n = (int)c__local;
  e = 0;
  lower = 0;
  upper = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (local_30);
  while( true ) {
    if (lower == upper) {
      return;
    }
    __range4._4_4_ = 0;
    __range4._0_4_ = 0;
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    __end4 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin(&pvVar3->elements);
    cst = (function_element *)
          std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::end
                    (&pvVar3->elements);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end4,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                  *)&cst);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_70 = __gnu_cxx::
                 __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                 ::operator*(&__end4);
      iVar2 = local_70->factor;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 != 1) {
        details::fail_fast("Postcondition","std::abs(cst.factor) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                           ,"99");
      }
      iVar2 = local_70->factor;
      __i = (size_t)e;
      e = e + 1;
      piVar4 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->A,__i);
      *piVar4 = iVar2;
      if (local_70->factor < 1) {
        __range4._4_4_ = __range4._4_4_ + 1;
      }
      else {
        __range4._0_4_ = (int)__range4 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end4);
    }
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    iVar2 = pvVar3->min;
    pvVar3 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](local_30,(long)lower);
    if (iVar2 == pvVar3->max) {
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      iVar2 = pvVar3->min;
      pbVar5 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar5->min = iVar2;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      iVar2 = pvVar3->max;
      pbVar5 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar5->max = iVar2;
    }
    else {
      local_74 = -__range4._4_4_;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      piVar6 = std::max<int>(&local_74,&pvVar3->min);
      iVar2 = *piVar6;
      pbVar5 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar5->min = iVar2;
      pvVar3 = std::
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               ::operator[](local_30,(long)lower);
      piVar6 = std::min<int>((int *)&__range4,&pvVar3->max);
      iVar2 = *piVar6;
      pbVar5 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
               ::operator[](&this->b,(long)lower);
      pbVar5->max = iVar2;
    }
    pbVar5 = std::
             unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
             ::operator[](&this->b,(long)lower);
    iVar2 = pbVar5->min;
    pbVar5 = std::
             unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
             ::operator[](&this->b,(long)lower);
    if (pbVar5->max < iVar2) break;
    lower = lower + 1;
  }
  details::fail_fast("Postcondition","b[i].min <= b[i].max",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                     ,"116");
}

Assistant:

solver_random_inequalities_101coeff(
      random_engine& rng_,
      int m_,
      int n_,
      const cost_type& c_,
      const std::vector<merged_constraint>& csts)
      : rng(rng_)
      , ap(csts, m_, n_)
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , P(std::make_unique<Float[]>(ap.size()))
      , c(c_)
      , dist(0.5)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }